

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleLineDirective(Preprocessor *this,Token directive)

{
  SourceRange range;
  bool bVar1;
  _Storage<unsigned_long,_true> _Var2;
  uchar *puVar3;
  undefined1 uVar4;
  optional<unsigned_long> oVar5;
  uint8_t in_stack_0000007f;
  optional<unsigned_long> lineNum;
  undefined1 in_stack_00000090 [16];
  SourceLocation in_stack_000000a0;
  optional<unsigned_char> levNum;
  LineDirectiveSyntax *result;
  Token level;
  Token fileName;
  Token lineNumber;
  Token *in_stack_fffffffffffffef8;
  Preprocessor *this_00;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  SVInt *in_stack_ffffffffffffff08;
  Token *this_01;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  SourceManager *in_stack_ffffffffffffff58;
  Token *in_stack_ffffffffffffff60;
  Token *in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  TokenKind in_stack_ffffffffffffff7e;
  Preprocessor *in_stack_ffffffffffffff80;
  _Optional_payload_base<unsigned_char> local_62;
  LineDirectiveSyntax *local_60;
  Token local_58;
  Token local_48;
  Token local_38;
  Token local_20;
  Trivia local_10;
  
  local_38 = expect(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  local_48 = expect(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  local_58 = expect(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  local_60 = BumpAllocator::
             emplace<slang::syntax::LineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                       ((BumpAllocator *)
                        CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                        (Token *)in_stack_ffffffffffffff58,
                        (Token *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar1 = Token::isMissing(&local_38);
  if (((!bVar1) && (bVar1 = Token::isMissing(&local_48), !bVar1)) &&
     (bVar1 = Token::isMissing(&local_58), !bVar1)) {
    this_01 = (Token *)&stack0xffffffffffffff88;
    Token::intValue(in_stack_fffffffffffffef8);
    local_62 = (_Optional_payload_base<unsigned_char>)
               SVInt::as<unsigned_char>(in_stack_ffffffffffffff08);
    SVInt::~SVInt((SVInt *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    this_00 = (Preprocessor *)&stack0xffffffffffffff58;
    Token::intValue((Token *)this_00);
    oVar5 = SVInt::as<unsigned_long>((SVInt *)this_01);
    _Var2._M_value =
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    uVar4 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged;
    SVInt::~SVInt((SVInt *)CONCAT17(uVar4,in_stack_ffffffffffffff00));
    bVar1 = std::optional<unsigned_char>::has_value((optional<unsigned_char> *)0x621b7c);
    if ((bVar1) &&
       (((puVar3 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x621b8f),
         *puVar3 == '\0' ||
         (puVar3 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x621ba8),
         *puVar3 == '\x01')) ||
        (puVar3 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x621bc1),
        *puVar3 == '\x02')))) {
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x621c61);
      if (bVar1) {
        Token::location(&local_20);
        std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x621c92);
        Token::valueText((Token *)CONCAT17(uVar4,in_stack_ffffffffffffff00));
        std::optional<unsigned_char>::operator*((optional<unsigned_char> *)0x621cbe);
        SourceManager::addLineDirective
                  ((SourceManager *)
                   lineNum.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_8_,in_stack_000000a0,
                   lineNum.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload._M_value,
                   (string_view)in_stack_00000090,in_stack_0000007f);
      }
    }
    else {
      Token::range(this_01);
      range.startLoc._7_1_ = uVar4;
      range.startLoc._0_7_ = in_stack_ffffffffffffff00;
      range.endLoc = (SourceLocation)_Var2._M_value;
      addDiag(this_00,SUB84((ulong)this_01 >> 0x20,0),range);
    }
  }
  Trivia::Trivia(&local_10,Directive,(SyntaxNode *)local_60);
  return local_10;
}

Assistant:

Trivia Preprocessor::handleLineDirective(Token directive) {
    Token lineNumber = expect(TokenKind::IntegerLiteral);
    Token fileName = expect(TokenKind::StringLiteral);
    Token level = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<LineDirectiveSyntax>(directive, lineNumber, fileName, level);

    if (!lineNumber.isMissing() && !fileName.isMissing() && !level.isMissing()) {
        auto levNum = level.intValue().as<uint8_t>();
        auto lineNum = lineNumber.intValue().as<size_t>();

        if (!levNum.has_value() || (*levNum != 0 && *levNum != 1 && *levNum != 2)) {
            // We don't actually use the level for anything, but the spec allows
            // only the values 0,1,2
            addDiag(diag::InvalidLineDirectiveLevel, level.range());
        }
        else if (lineNum) {
            // We should only notify the source manager about the line directive if it
            // is well formed, to avoid very strange line number issues.
            sourceManager.addLineDirective(directive.location(), *lineNum, fileName.valueText(),
                                           *levNum);
        }
    }
    return Trivia(TriviaKind::Directive, result);
}